

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotShadedG(char *label_id,_func_ImPlotPoint_void_ptr_int *g1,void *data1,
                        _func_ImPlotPoint_void_ptr_int *g2,void *data2,int count,int offset)

{
  GetterFuncPtr local_30;
  GetterFuncPtr local_18;
  
  if (count == 0) {
    local_30.Offset = 0;
  }
  else {
    local_30.Offset = (offset % count + count) % count;
  }
  local_30.Getter = g1;
  local_30.Data = data1;
  local_30.Count = count;
  local_18.Getter = g2;
  local_18.Data = data2;
  local_18.Count = count;
  local_18.Offset = local_30.Offset;
  PlotShadedEx<ImPlot::GetterFuncPtr,ImPlot::GetterFuncPtr>(label_id,&local_30,&local_18,true);
  return;
}

Assistant:

void PlotShadedG(const char* label_id, ImPlotPoint (*g1)(void* data, int idx), void* data1, ImPlotPoint (*g2)(void* data, int idx), void* data2, int count, int offset) {
    GetterFuncPtr getter1(g1, data1, count, offset);
    GetterFuncPtr getter2(g2, data2, count, offset);
    PlotShadedEx(label_id, getter1, getter2, true);
}